

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O2

Saig_ManCba_t * Saig_ManCbaStart(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,int fVerbose)

{
  Saig_ManCba_t *pSVar1;
  
  pSVar1 = (Saig_ManCba_t *)calloc(1,0x38);
  pSVar1->pAig = pAig;
  pSVar1->pCex = pCex;
  pSVar1->nInputs = nInputs;
  pSVar1->fVerbose = fVerbose;
  return pSVar1;
}

Assistant:

Saig_ManCba_t * Saig_ManCbaStart( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, int fVerbose )
{
    Saig_ManCba_t * p;
    p = ABC_CALLOC( Saig_ManCba_t, 1 );
    p->pAig = pAig;
    p->pCex = pCex;
    p->nInputs = nInputs;
    p->fVerbose = fVerbose;
    return p;
}